

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameIdenticalPayoff.cpp
# Opt level: O0

BayesianGameIdenticalPayoff *
BayesianGameIdenticalPayoff::GenerateRandomBG
          (size_t nrAgents,vector<unsigned_long,_std::allocator<unsigned_long>_> *acs,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *obs)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  double p;
  BayesianGameIdenticalPayoff *pBVar4;
  BayesianGameIdenticalPayoff *in_RDI;
  bool in_stack_00000027;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000028;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000030;
  size_t in_stack_00000038;
  BayesianGameIdenticalPayoff *in_stack_00000040;
  Index jtype_3;
  Index jtype_2;
  double r;
  Index jtype_1;
  double sum;
  vector<double,_std::allocator<double>_> typeProbs;
  double rn;
  Index ja;
  Index jtype;
  BayesianGameIdenticalPayoff *bgip;
  Index in_stack_ffffffffffffff18;
  Index in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  value_type_conflict3 *in_stack_ffffffffffffff28;
  BayesianGameIdenticalPayoff *in_stack_ffffffffffffff30;
  BayesianGameBase *in_stack_ffffffffffffff58;
  BayesianGameBase *in_stack_ffffffffffffff60;
  uint local_78;
  uint local_74;
  uint local_64;
  vector<double,_std::allocator<double>_> local_58;
  double local_40;
  uint local_38;
  uint local_28;
  byte local_21;
  
  local_21 = 0;
  BayesianGameIdenticalPayoff
            (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028,
             in_stack_00000027);
  local_28 = 0;
  while( true ) {
    uVar2 = (ulong)local_28;
    sVar3 = BayesianGameBase::GetNrJointTypes((BayesianGameBase *)in_stack_ffffffffffffff30);
    if (sVar3 <= uVar2) break;
    local_38 = 0;
    while( true ) {
      in_stack_ffffffffffffff58 = (BayesianGameBase *)(ulong)local_38;
      in_stack_ffffffffffffff60 =
           (BayesianGameBase *)
           BayesianGameBase::GetNrJointActions((BayesianGameBase *)in_stack_ffffffffffffff30);
      if (in_stack_ffffffffffffff60 <= in_stack_ffffffffffffff58) break;
      iVar1 = rand();
      local_40 = ((double)iVar1 + -1073741823.5) / 107374182.35;
      SetUtility((BayesianGameIdenticalPayoff *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,4.50003339941622e-317);
      local_38 = local_38 + 1;
    }
    local_28 = local_28 + 1;
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x8afb21);
  local_64 = 0;
  while( true ) {
    p = (double)BayesianGameBase::GetNrJointTypes((BayesianGameBase *)in_stack_ffffffffffffff30);
    if ((ulong)p <= (ulong)local_64) break;
    rand();
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28);
    local_64 = local_64 + 1;
  }
  local_74 = 0;
  while( true ) {
    sVar3 = BayesianGameBase::GetNrJointTypes((BayesianGameBase *)in_stack_ffffffffffffff30);
    if (sVar3 <= local_74) break;
    std::vector<double,_std::allocator<double>_>::operator[](&local_58,(ulong)local_74);
    local_74 = local_74 + 1;
  }
  local_78 = 0;
  while( true ) {
    pBVar4 = (BayesianGameIdenticalPayoff *)(ulong)local_78;
    in_stack_ffffffffffffff30 =
         (BayesianGameIdenticalPayoff *)
         BayesianGameBase::GetNrJointTypes((BayesianGameBase *)in_stack_ffffffffffffff30);
    if (in_stack_ffffffffffffff30 <= pBVar4) break;
    std::vector<double,_std::allocator<double>_>::operator[](&local_58,(ulong)local_78);
    BayesianGameBase::SetProbability
              (in_stack_ffffffffffffff60,(Index)((ulong)in_stack_ffffffffffffff58 >> 0x20),p);
    local_78 = local_78 + 1;
  }
  local_21 = 1;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30);
  if ((local_21 & 1) == 0) {
    ~BayesianGameIdenticalPayoff(in_stack_ffffffffffffff30);
  }
  return in_RDI;
}

Assistant:

BayesianGameIdenticalPayoff 
BayesianGameIdenticalPayoff::GenerateRandomBG(
            size_t nrAgents,
            std::vector<size_t> acs,
            std::vector<size_t> obs
        )
{
    BayesianGameIdenticalPayoff bgip(nrAgents, acs, obs);
    for(Index jtype = 0; jtype < bgip.GetNrJointTypes(); jtype++)
        for(Index ja = 0; ja < bgip.GetNrJointActions(); ja++)
        {
            double rn = (rand() - (0.5 * RAND_MAX)) / (RAND_MAX / 20.0);
            bgip.SetUtility(jtype, ja, rn );
        }

    //create random, normalized prob distr.
    vector<double> typeProbs;
    double sum = 0.0;
    for(Index jtype = 0; jtype < bgip.GetNrJointTypes(); jtype++)
    {
        double r = ((double)rand()) / RAND_MAX;
        typeProbs.push_back(r);
    }
    for(Index jtype = 0; jtype < bgip.GetNrJointTypes(); jtype++)
        sum += typeProbs[jtype];
    for(Index jtype = 0; jtype < bgip.GetNrJointTypes(); jtype++)
        bgip.SetProbability(jtype, typeProbs[jtype] / sum );

    //bgip.Print();
    return(bgip);
}